

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

int __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,char *__name)

{
  int iVar1;
  LinkType LVar2;
  int extraout_EAX;
  long extraout_RAX;
  long extraout_RAX_00;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int v;
  bool bVar9;
  LinkType nilParent;
  LinkType local_34;
  
  iVar5 = (int)__name;
  local_34 = -1;
  if (iVar5 == -1) {
    bVar9 = true;
  }
  else {
    bVar9 = -1 < *(int *)(*(long *)this[2].rootNode + 0x18 + (long)iVar5 * 0x20);
  }
  lVar3 = *(long *)this[2].rootNode;
  lVar6 = (long)iVar5 * 0x20;
  iVar8 = *(int *)(lVar3 + 0x10 + lVar6);
  v = *(int *)(lVar3 + 0x14 + lVar6);
  if (iVar8 == -1) {
    transplant(this,iVar5,v,&local_34);
    lVar3 = extraout_RAX;
    goto LAB_002a2817;
  }
  if (v == -1) {
    transplant(this,iVar5,iVar8,&local_34);
    lVar3 = extraout_RAX_00;
    v = iVar8;
    goto LAB_002a2817;
  }
  do {
    iVar8 = v;
    v = *(int *)(lVar3 + 0x10 + (long)iVar8 * 0x20);
  } while (v != -1);
  if (iVar8 == -1) {
    bVar9 = true;
  }
  else {
    bVar9 = -1 < *(int *)(lVar3 + 0x18 + (long)iVar8 * 0x20);
  }
  local_34 = -1;
  lVar7 = (long)iVar8 * 0x20;
  v = *(int *)(lVar3 + 0x14 + lVar7);
  if ((*(uint *)(lVar3 + 0x18 + lVar7) & 0x7fffffff) - 1 == iVar5) {
    iVar1 = v;
    LVar2 = iVar8;
    if (v != -1) goto LAB_002a27a8;
  }
  else {
    transplant(this,iVar8,v,&local_34);
    lVar3 = *(long *)this[2].rootNode;
    iVar1 = *(int *)(lVar3 + 0x14 + lVar6);
    *(int *)(lVar3 + 0x14 + lVar7) = iVar1;
LAB_002a27a8:
    *(uint *)(lVar3 + 0x18 + (long)iVar1 * 0x20) =
         iVar8 + 1U | *(uint *)(lVar3 + 0x18 + (long)iVar1 * 0x20) & 0x80000000;
    LVar2 = local_34;
  }
  local_34 = LVar2;
  transplant(this,iVar5,iVar8,&local_34);
  lVar3 = *(long *)this[2].rootNode;
  iVar5 = *(int *)(lVar3 + 0x10 + lVar6);
  *(int *)(lVar3 + 0x10 + lVar7) = iVar5;
  lVar4 = (long)iVar5 * 0x20;
  *(uint *)(lVar3 + 0x18 + lVar4) = iVar8 + 1U | *(uint *)(lVar3 + 0x18 + lVar4) & 0x80000000;
  *(uint *)(lVar3 + 0x18 + lVar7) =
       *(uint *)(lVar3 + 0x18 + lVar6) & 0x80000000 | *(uint *)(lVar3 + 0x18 + lVar7) & 0x7fffffff;
LAB_002a2817:
  iVar5 = (int)lVar3;
  if (bVar9) {
    deleteFixup(this,v,local_34);
    iVar5 = extraout_EAX;
  }
  return iVar5;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }